

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::keyPressEvent(QTreeView *this,QKeyEvent *event)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_48,(QAbstractItemView *)this);
  if ((((-1 < (int)local_48) && (-1 < (long)local_48)) &&
      (local_38.ptr != (QAbstractItemModel *)0x0 &&
       local_38.ptr == *(QAbstractItemModel **)(lVar2 + 0x2f8))) &&
     (*(char *)(lVar2 + 0x5c2) == '\x01')) {
    iVar1 = *(int *)(event + 0x40);
    if (iVar1 == 0x2d) {
      collapse(this,(QModelIndex *)&local_48);
    }
    else if (iVar1 == 0x2b) {
      expand(this,(QModelIndex *)&local_48);
    }
    else if (iVar1 == 0x2a) {
      expandRecursively(this,(QModelIndex *)&local_48,-1);
    }
  }
  QAbstractItemView::keyPressEvent((QAbstractItemView *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::keyPressEvent(QKeyEvent *event)
{
    Q_D(QTreeView);
    QModelIndex current = currentIndex();
    //this is the management of the expansion
    if (d->isIndexValid(current) && d->model && d->itemsExpandable) {
        switch (event->key()) {
        case Qt::Key_Asterisk: {
            expandRecursively(current);
            break; }
        case Qt::Key_Plus:
            expand(current);
            break;
        case Qt::Key_Minus:
            collapse(current);
            break;
        }
    }

    QAbstractItemView::keyPressEvent(event);
}